

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgkcsl(fitsfile *fptr,char *keyname,int *length,int *comlength,int *status)

{
  if (0 < *status) {
    return *status;
  }
  ffglkut(fptr,keyname,0,0,0,(char *)0x0,length,(char *)0x0,comlength,status);
  return *status;
}

Assistant:

int ffgkcsl( fitsfile *fptr,     /* I - FITS file pointer             */
           const char *keyname, /* I - name of keyword to read       */
           int *length,         /* O - length of the string value    */
           int *comlength,      /* O - length of comment string      */
           int  *status)        /* IO - error status                 */
/*
  Get the length of the keyword value string and comment string.
  This routine explicitly supports the CONTINUE convention for long string values.
*/
{
   if (*status > 0)
      return(*status);
      
   ffglkut(fptr, keyname, 0, 0, 0, (char *)0, length, (char *)0,
           comlength, status); 
       
   return(*status);
}